

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O0

void __thiscall irr::scene::CMeshCache::addMesh(CMeshCache *this,path *filename,IAnimatedMesh *mesh)

{
  long *in_RDX;
  MeshEntry *in_RDI;
  MeshEntry e;
  MeshEntry *in_stack_ffffffffffffffa0;
  
  IReferenceCounted::grab((IReferenceCounted *)((long)in_RDX + *(long *)(*in_RDX + -0x18)));
  MeshEntry::MeshEntry(in_stack_ffffffffffffffa0,(path *)in_RDI);
  core::array<irr::scene::CMeshCache::MeshEntry>::push_back
            ((array<irr::scene::CMeshCache::MeshEntry> *)in_stack_ffffffffffffffa0,in_RDI);
  MeshEntry::~MeshEntry((MeshEntry *)0x304312);
  return;
}

Assistant:

void CMeshCache::addMesh(const io::path &filename, IAnimatedMesh *mesh)
{
	mesh->grab();

	MeshEntry e(filename);
	e.Mesh = mesh;

	Meshes.push_back(e);
}